

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O0

bool tinyusdz::InheritPrimSpec(PrimSpec *dst,PrimSpec *src,string *warn,string *err)

{
  bool bVar1;
  string *err_local;
  string *warn_local;
  PrimSpec *src_local;
  PrimSpec *dst_local;
  
  bVar1 = detail::InheritPrimSpecImpl(dst,src,warn,err);
  return bVar1;
}

Assistant:

bool InheritPrimSpec(PrimSpec &dst, const PrimSpec &src, std::string *warn,
                     std::string *err) {
  return detail::InheritPrimSpecImpl(dst, src, warn, err);
}